

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O2

int ddLeavesInt(DdNode *n)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar2 = 0;
  iVar3 = 0;
  do {
    if (((ulong)n->next & 1) != 0) {
LAB_0067173b:
      return iVar2 + iVar3;
    }
    n->next = (DdNode *)((ulong)n->next | 1);
    if (n->index == 0x7fffffff) {
      iVar2 = 1;
      goto LAB_0067173b;
    }
    iVar1 = ddLeavesInt((n->type).kids.T);
    n = (DdNode *)((ulong)(n->type).kids.E & 0xfffffffffffffffe);
    iVar3 = iVar3 + iVar1;
  } while( true );
}

Assistant:

static int
ddLeavesInt(
  DdNode * n)
{
    int tval, eval;

    if (Cudd_IsComplement(n->next)) {
        return(0);
    }
    n->next = Cudd_Not(n->next);
    if (cuddIsConstant(n)) {
        return(1);
    }
    tval = ddLeavesInt(cuddT(n));
    eval = ddLeavesInt(Cudd_Regular(cuddE(n)));
    return(tval + eval);

}